

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O0

char * scanformat(lua_State *L,char *strfrmt,char *form)

{
  byte *pbVar1;
  char *pcVar2;
  ushort **ppuVar3;
  bool bVar4;
  byte *local_28;
  char *p;
  char *form_local;
  char *strfrmt_local;
  lua_State *L_local;
  
  local_28 = (byte *)strfrmt;
  while( true ) {
    bVar4 = false;
    if (*local_28 != 0) {
      pcVar2 = strchr("-+ #0",(int)(char)*local_28);
      bVar4 = pcVar2 != (char *)0x0;
    }
    if (!bVar4) break;
    local_28 = local_28 + 1;
  }
  if (5 < (ulong)((long)local_28 - (long)strfrmt)) {
    luaL_error(L,"invalid format (repeated flags)");
  }
  ppuVar3 = __ctype_b_loc();
  if (((*ppuVar3)[(int)(uint)*local_28] & 0x800) != 0) {
    local_28 = local_28 + 1;
  }
  ppuVar3 = __ctype_b_loc();
  if (((*ppuVar3)[(int)(uint)*local_28] & 0x800) != 0) {
    local_28 = local_28 + 1;
  }
  if (*local_28 == 0x2e) {
    ppuVar3 = __ctype_b_loc();
    pbVar1 = local_28 + 1;
    if (((*ppuVar3)[(int)(uint)local_28[1]] & 0x800) != 0) {
      pbVar1 = local_28 + 2;
    }
    local_28 = pbVar1;
    ppuVar3 = __ctype_b_loc();
    if (((*ppuVar3)[(int)(uint)*local_28] & 0x800) != 0) {
      local_28 = local_28 + 1;
    }
  }
  ppuVar3 = __ctype_b_loc();
  if (((*ppuVar3)[(int)(uint)*local_28] & 0x800) != 0) {
    luaL_error(L,"invalid format (width or precision too long)");
  }
  *form = '%';
  memcpy(form + 1,strfrmt,(size_t)(local_28 + (1 - (long)strfrmt)));
  (form + 1)[(long)(local_28 + (1 - (long)strfrmt))] = '\0';
  return (char *)local_28;
}

Assistant:

static const char *scanformat (lua_State *L, const char *strfrmt, char *form) {
  const char *p = strfrmt;
  while (*p != '\0' && strchr(L_FMTFLAGS, *p) != NULL) p++;  /* skip flags */
  if ((size_t)(p - strfrmt) >= sizeof(L_FMTFLAGS)/sizeof(char))
    luaL_error(L, "invalid format (repeated flags)");
  if (isdigit(uchar(*p))) p++;  /* skip width */
  if (isdigit(uchar(*p))) p++;  /* (2 digits at most) */
  if (*p == '.') {
    p++;
    if (isdigit(uchar(*p))) p++;  /* skip precision */
    if (isdigit(uchar(*p))) p++;  /* (2 digits at most) */
  }
  if (isdigit(uchar(*p)))
    luaL_error(L, "invalid format (width or precision too long)");
  *(form++) = '%';
  memcpy(form, strfrmt, ((p - strfrmt) + 1) * sizeof(char));
  form += (p - strfrmt) + 1;
  *form = '\0';
  return p;
}